

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O0

array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> * __thiscall
polyscope::CameraParameters::generateCameraRayCorners(CameraParameters *this)

{
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar1;
  reference pvVar2;
  mat<4,_4,_float,_(glm::qualifier)0> *in_RSI;
  CameraParameters *in_RDI;
  float fVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  vec3 vVar9;
  vec<3,_float,_(glm::qualifier)0> vVar10;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> *outCorners;
  vec3 worldRayDir;
  vec3 worldPos;
  vec3 screenPos3;
  float iX;
  float iY;
  size_t i;
  vec3 rootPos;
  vec4 viewport;
  mat4 projMat;
  mat4x4 viewMat;
  undefined4 in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  CameraParameters *in_stack_fffffffffffffeb0;
  vec<3,float,(glm::qualifier)0> *this_00;
  CameraParameters *this_01;
  undefined4 in_stack_fffffffffffffec8;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffffed8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  vec<3,float,(glm::qualifier)0> local_d4 [12];
  float local_c8;
  float local_c4;
  long local_c0;
  undefined8 local_b8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_b0;
  undefined8 local_a4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_9c;
  vec<4,float,(glm::qualifier)0> local_98 [152];
  undefined1 auVar8 [56];
  
  this_01 = in_RDI;
  getViewMat(in_stack_fffffffffffffeb0);
  fVar3 = getFoVVerticalDegrees((CameraParameters *)0x451e7d);
  fVar3 = glm::radians<float>(fVar3);
  getAspectRatioWidthOverHeight((CameraParameters *)0x451e92);
  glm::infinitePerspective<float>
            ((float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),SUB84(in_stack_fffffffffffffeb0,0),
             in_stack_fffffffffffffeac);
  auVar8 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>(local_98,0.0,0.0,1.0,1.0);
  vVar9 = getPosition(this_01);
  local_b0 = vVar9.field_2;
  auVar4._0_8_ = vVar9._0_8_;
  auVar4._8_56_ = auVar8;
  local_b8 = vmovlpd_avx(auVar4._0_16_);
  local_c0 = 0;
  local_a4 = local_b8;
  local_9c = local_b0;
  for (local_c4 = 0.0; local_c4 <= 1.0; local_c4 = local_c4 + 1.0) {
    for (local_c8 = 0.0; local_c8 <= 1.0; local_c8 = local_c8 + 1.0) {
      auVar8 = (undefined1  [56])0x0;
      this_00 = local_d4;
      glm::vec<3,float,(glm::qualifier)0>::vec<float,double,double>
                (this_00,local_c8,1.0 - (double)local_c4,0.0);
      vVar10 = glm::unProject<float,float,(glm::qualifier)0>
                         ((vec<3,_float,_(glm::qualifier)0> *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffed8,in_RSI,
                          (vec<4,_float,_(glm::qualifier)0> *)
                          CONCAT44(fVar3,in_stack_fffffffffffffec8));
      auVar5._0_8_ = vVar10._0_8_;
      auVar5._8_56_ = auVar8;
      vmovlpd_avx(auVar5._0_16_);
      vVar10 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)this_01,
                              (vec<3,_float,_(glm::qualifier)0> *)in_RDI);
      auVar6._0_8_ = vVar10._0_8_;
      auVar6._8_56_ = auVar8;
      vmovlpd_avx(auVar6._0_16_);
      vVar10 = glm::normalize<3,float,(glm::qualifier)0>
                         ((vec<3,_float,_(glm::qualifier)0> *)this_01);
      auVar7._0_8_ = vVar10._0_8_;
      auVar7._8_56_ = auVar8;
      pmVar1 = (mat<4,_4,_float,_(glm::qualifier)0> *)vmovlpd_avx(auVar7._0_16_);
      in_stack_fffffffffffffed8 = pmVar1;
      in_stack_fffffffffffffee0 = vVar10.field_2;
      pvVar2 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>::operator[]
                         ((array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> *)this_00,
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      *(mat<4,_4,_float,_(glm::qualifier)0> **)pvVar2 = pmVar1;
      pvVar2->field_2 = vVar10.field_2;
      local_c0 = local_c0 + 1;
    }
  }
  return (array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> *)this_01;
}

Assistant:

std::array<glm::vec3, 4> CameraParameters::generateCameraRayCorners() const {

  // prep values
  glm::mat4x4 viewMat = getViewMat();
  glm::mat4 projMat =
      glm::infinitePerspective(glm::radians(getFoVVerticalDegrees()), getAspectRatioWidthOverHeight(), 1.f);
  glm::vec4 viewport = {0., 0., 1., 1.};
  glm::vec3 rootPos = getPosition();

  std::array<glm::vec3, 4> outCorners;

  size_t i = 0;
  for (float iY = 0; iY <= 1.; iY++) {
    for (float iX = 0; iX <= 1.; iX++) {
      glm::vec3 screenPos3 = glm::vec3{iX, 1. - iY, 0.};
      glm::vec3 worldPos = glm::unProject(screenPos3, viewMat, projMat, viewport);
      glm::vec3 worldRayDir = glm::normalize(worldPos - rootPos);
      outCorners[i] = worldRayDir;
      i++;
    }
  }

  return outCorners;
}